

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O2

float crnlib::mitchell(float t,float B,float C)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = -t;
  if (-t <= t) {
    fVar2 = t;
  }
  fVar3 = t * t;
  if (fVar2 < 1.0) {
    return ((6.0 - (B + B)) +
           (C * 6.0 + B * 12.0 + -18.0) * fVar3 + fVar2 * fVar3 * (C * -6.0 + B * -9.0 + 12.0)) /
           6.0;
  }
  fVar1 = 0.0;
  if (fVar2 < 2.0) {
    fVar1 = (B * 8.0 + C * 24.0 +
            (B * -12.0 + C * -48.0) * fVar2 +
            (B * 6.0 + C * 30.0) * fVar3 + fVar3 * fVar2 * (C * -6.0 - B)) / 6.0;
  }
  return fVar1;
}

Assistant:

static float mitchell(float t, const float B, const float C)
    {
        float tt;

        tt = t * t;

        if (t < 0.0f)
        {
            t = -t;
        }

        if (t < 1.0f)
        {
            t = (((12.0f - 9.0f * B - 6.0f * C) * (t * tt)) + ((-18.0f + 12.0f * B + 6.0f * C) * tt) + (6.0f - 2.0f * B));

            return (t / 6.0f);
        }
        else if (t < 2.0f)
        {
            t = (((-1.0f * B - 6.0f * C) * (t * tt)) + ((6.0f * B + 30.0f * C) * tt) + ((-12.0f * B - 48.0f * C) * t) + (8.0f * B + 24.0f * C));

            return (t / 6.0f);
        }

        return 0.0f;
    }